

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRnglists.cpp
# Opt level: O1

DWARFAddressRangesVector * __thiscall
llvm::DWARFDebugRnglist::getAbsoluteRanges
          (DWARFAddressRangesVector *__return_storage_ptr__,DWARFDebugRnglist *this,
          Optional<llvm::object::SectionedAddress> BaseAddr,DWARFUnit *U)

{
  pointer *ppDVar1;
  uint8_t uVar2;
  pointer pRVar3;
  iterator __position;
  int iVar4;
  pointer pRVar5;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 local_60;
  char local_50;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 local_48;
  uint64_t local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar5 = (this->super_DWARFListType<llvm::RangeListEntry>).Entries.
           super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar3 = (this->super_DWARFListType<llvm::RangeListEntry>).Entries.
           super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pRVar5 == pRVar3) {
      return __return_storage_ptr__;
    }
    uVar2 = (pRVar5->super_DWARFListEntryBase).EntryKind;
    if (uVar2 == '\0') {
      iVar4 = 2;
      goto LAB_00d83dfd;
    }
    if (uVar2 == '\x05') {
      BaseAddr.Storage.field_0.value.SectionIndex = (pRVar5->super_DWARFListEntryBase).SectionIndex;
      BaseAddr.Storage.field_0.value.Address = pRVar5->Value0;
      if (BaseAddr.Storage.hasVal != true) {
        BaseAddr.Storage.hasVal = true;
      }
      iVar4 = 3;
      goto LAB_00d83dfd;
    }
    if (uVar2 == '\x01') {
      DWARFUnit::getAddrOffsetSectionItem
                ((Optional<llvm::object::SectionedAddress> *)&local_48.value,U,
                 (uint32_t)pRVar5->Value0);
      BaseAddr.Storage.hasVal = SUB81(local_38,0);
      BaseAddr.Storage.field_0.value.Address = local_48.value.Address;
      BaseAddr.Storage.field_0.value.SectionIndex = local_48.value.SectionIndex;
      iVar4 = 3;
      if (BaseAddr.Storage.hasVal == false) {
        BaseAddr.Storage.field_0.value.Address = pRVar5->Value0;
        BaseAddr.Storage.field_0.value.SectionIndex = 0xffffffffffffffff;
        BaseAddr.Storage.hasVal = true;
      }
      goto LAB_00d83dfd;
    }
    local_38 = (pRVar5->super_DWARFListEntryBase).SectionIndex;
    if ((local_38 == 0xffffffffffffffff & BaseAddr.Storage.hasVal) == 1) {
      local_38 = BaseAddr.Storage.field_0.value.SectionIndex;
    }
    switch((pRVar5->super_DWARFListEntryBase).EntryKind) {
    case '\x03':
      DWARFUnit::getAddrOffsetSectionItem
                ((Optional<llvm::object::SectionedAddress> *)&local_60.value,U,
                 (uint32_t)pRVar5->Value0);
      if (local_50 == '\0') {
        local_60.value.Address = 0;
        local_60.value.SectionIndex = 0xffffffffffffffff;
        local_50 = '\x01';
      }
      if (local_50 == '\0') {
        __assert_fail("hasVal",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                      ,0xad,
                      "T &llvm::optional_detail::OptionalStorage<llvm::object::SectionedAddress>::getValue() & [T = llvm::object::SectionedAddress]"
                     );
      }
      local_38 = local_60.value.SectionIndex;
      local_48.value.Address = local_60.value.Address;
      goto LAB_00d83d9c;
    case '\x04':
      local_48.value.Address = pRVar5->Value0;
      local_48.value.SectionIndex = pRVar5->Value1;
      if (BaseAddr.Storage.hasVal != false) {
        local_48.value.Address = local_48.value.Address + BaseAddr.Storage.field_0.value.Address;
        local_48.value.SectionIndex =
             local_48.value.SectionIndex + BaseAddr.Storage.field_0.value.Address;
      }
      break;
    default:
      llvm_unreachable_internal
                ("Unsupported range list encoding",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugRnglists.cpp"
                 ,0xa6);
    case '\x06':
      local_48.value.Address = pRVar5->Value0;
      local_48.value.SectionIndex = pRVar5->Value1;
      break;
    case '\a':
      local_48.value.Address = pRVar5->Value0;
LAB_00d83d9c:
      local_48.value.SectionIndex = local_48.value.Address + pRVar5->Value1;
    }
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>>::
      _M_realloc_insert<llvm::DWARFAddressRange_const&>
                ((vector<llvm::DWARFAddressRange,std::allocator<llvm::DWARFAddressRange>> *)
                 __return_storage_ptr__,__position,(DWARFAddressRange *)&local_48.value);
    }
    else {
      (__position._M_current)->SectionIndex = local_38;
      (__position._M_current)->LowPC = local_48.value.Address;
      (__position._M_current)->HighPC = local_48.value.SectionIndex;
      ppDVar1 = &(__return_storage_ptr__->
                 super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppDVar1 = *ppDVar1 + 1;
    }
    iVar4 = 0;
LAB_00d83dfd:
    if ((iVar4 != 3) && (iVar4 != 0)) {
      return __return_storage_ptr__;
    }
    pRVar5 = pRVar5 + 1;
  } while( true );
}

Assistant:

DWARFAddressRangesVector DWARFDebugRnglist::getAbsoluteRanges(
    llvm::Optional<object::SectionedAddress> BaseAddr, DWARFUnit &U) const {
  DWARFAddressRangesVector Res;
  for (const RangeListEntry &RLE : Entries) {
    if (RLE.EntryKind == dwarf::DW_RLE_end_of_list)
      break;
    if (RLE.EntryKind == dwarf::DW_RLE_base_addressx) {
      BaseAddr = U.getAddrOffsetSectionItem(RLE.Value0);
      if (!BaseAddr)
        BaseAddr = {RLE.Value0, -1ULL};
      continue;
    }
    if (RLE.EntryKind == dwarf::DW_RLE_base_address) {
      BaseAddr = {RLE.Value0, RLE.SectionIndex};
      continue;
    }

    DWARFAddressRange E;
    E.SectionIndex = RLE.SectionIndex;
    if (BaseAddr && E.SectionIndex == -1ULL)
      E.SectionIndex = BaseAddr->SectionIndex;

    switch (RLE.EntryKind) {
    case dwarf::DW_RLE_offset_pair:
      E.LowPC = RLE.Value0;
      E.HighPC = RLE.Value1;
      if (BaseAddr) {
        E.LowPC += BaseAddr->Address;
        E.HighPC += BaseAddr->Address;
      }
      break;
    case dwarf::DW_RLE_start_end:
      E.LowPC = RLE.Value0;
      E.HighPC = RLE.Value1;
      break;
    case dwarf::DW_RLE_start_length:
      E.LowPC = RLE.Value0;
      E.HighPC = E.LowPC + RLE.Value1;
      break;
    case dwarf::DW_RLE_startx_length: {
      auto Start = U.getAddrOffsetSectionItem(RLE.Value0);
      if (!Start)
        Start = {0, -1ULL};
      E.SectionIndex = Start->SectionIndex;
      E.LowPC = Start->Address;
      E.HighPC = E.LowPC + RLE.Value1;
      break;
    }
    default:
      // Unsupported encodings should have been reported during extraction,
      // so we should not run into any here.
      llvm_unreachable("Unsupported range list encoding");
    }
    Res.push_back(E);
  }
  return Res;
}